

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNodePtr n2;
  int i;
  xmlNodeSetPtr set2_local;
  xmlNodeSetPtr set1_local;
  
  n2._4_4_ = 0;
  while( true ) {
    if (set2->nodeNr <= n2._4_4_) {
      set2->nodeNr = 0;
      return set1;
    }
    pxVar1 = set2->nodeTab[n2._4_4_];
    if ((set1->nodeMax <= set1->nodeNr) && (iVar2 = xmlXPathNodeSetGrow(set1), iVar2 < 0)) break;
    iVar2 = set1->nodeNr;
    set1->nodeNr = iVar2 + 1;
    set1->nodeTab[iVar2] = pxVar1;
    set2->nodeTab[n2._4_4_] = (xmlNodePtr)0x0;
    n2._4_4_ = n2._4_4_ + 1;
  }
  xmlXPathFreeNodeSet(set1);
  xmlXPathNodeSetClear(set2,1);
  return (xmlNodeSetPtr)0x0;
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClearNoDupls(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i;
	xmlNodePtr n2;

	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
            if (set1->nodeNr >= set1->nodeMax) {
                if (xmlXPathNodeSetGrow(set1) < 0)
                    goto error;
            }
	    set1->nodeTab[set1->nodeNr++] = n2;
            set2->nodeTab[i] = NULL;
	}
    }
    set2->nodeNr = 0;
    return(set1);

error:
    xmlXPathFreeNodeSet(set1);
    xmlXPathNodeSetClear(set2, 1);
    return(NULL);
}